

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O0

void wallet::wallet_tests::ComputeTimeSmart_invoker(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_wrap_stringstream<char> *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  long in_FS_OFFSET;
  basic_wrap_stringstream<char> *in_stack_ffffffffffffece8;
  std_string *in_stack_ffffffffffffecf0;
  basic_wrap_stringstream<char> *in_stack_ffffffffffffecf8;
  const_string *in_stack_ffffffffffffed10;
  size_t in_stack_ffffffffffffed18;
  undefined1 *__s;
  const_string *in_stack_ffffffffffffed20;
  const_string *file;
  unit_test_log_t *in_stack_ffffffffffffed28;
  ComputeTimeSmart *in_stack_ffffffffffffee78;
  undefined1 local_1140 [320];
  undefined8 local_1000;
  undefined1 local_fa8 [408];
  undefined1 local_e10 [408];
  undefined1 local_c78 [408];
  ComputeTimeSmart t;
  undefined1 local_1a0 [408];
  long local_8;
  
  local_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecf8,
             (pointer)in_stack_ffffffffffffecf0,(unsigned_long)in_stack_ffffffffffffece8);
  memset(local_1a0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_ffffffffffffece8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_ffffffffffffece8);
  boost::operator<<(in_stack_ffffffffffffecf8,(char *)in_stack_ffffffffffffecf0);
  boost::operator<<(in_stack_ffffffffffffecf8,(char (*) [17])in_stack_ffffffffffffecf0);
  boost::operator<<(in_stack_ffffffffffffecf8,(char (*) [15])in_stack_ffffffffffffecf0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_ffffffffffffecf8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecf8,in_stack_ffffffffffffecf0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_ffffffffffffed28,in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
             in_stack_ffffffffffffed10);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_ffffffffffffece8);
  ComputeTimeSmart::ComputeTimeSmart((ComputeTimeSmart *)in_stack_ffffffffffffece8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecf8,
             (pointer)in_stack_ffffffffffffecf0,(unsigned_long)in_stack_ffffffffffffece8);
  memset(local_c78,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_ffffffffffffece8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_ffffffffffffece8);
  boost::operator<<(in_stack_ffffffffffffecf8,(char *)in_stack_ffffffffffffecf0);
  boost::operator<<(in_stack_ffffffffffffecf8,(char (*) [17])in_stack_ffffffffffffecf0);
  boost::operator<<(in_stack_ffffffffffffecf8,(char (*) [16])in_stack_ffffffffffffecf0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_ffffffffffffecf8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecf8,in_stack_ffffffffffffecf0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_ffffffffffffed28,in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
             in_stack_ffffffffffffed10);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_ffffffffffffece8);
  boost::unit_test::setup_conditional<wallet::wallet_tests::ComputeTimeSmart>
            ((ComputeTimeSmart *)0xe2d58f);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecf8,
             (pointer)in_stack_ffffffffffffecf0,(unsigned_long)in_stack_ffffffffffffece8);
  memset(local_e10,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_ffffffffffffece8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_ffffffffffffece8);
  boost::operator<<(in_stack_ffffffffffffecf8,(char *)in_stack_ffffffffffffecf0);
  boost::operator<<(in_stack_ffffffffffffecf8,(char (*) [17])in_stack_ffffffffffffecf0);
  boost::operator<<(in_stack_ffffffffffffecf8,(char (*) [13])in_stack_ffffffffffffecf0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_ffffffffffffecf8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecf8,in_stack_ffffffffffffecf0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_ffffffffffffed28,in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
             in_stack_ffffffffffffed10);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_ffffffffffffece8);
  ComputeTimeSmart::test_method(in_stack_ffffffffffffee78);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecf8,
             (pointer)in_stack_ffffffffffffecf0,(unsigned_long)in_stack_ffffffffffffece8);
  memset(local_fa8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_ffffffffffffece8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_ffffffffffffece8);
  boost::operator<<(in_stack_ffffffffffffecf8,(char *)in_stack_ffffffffffffecf0);
  boost::operator<<(in_stack_ffffffffffffecf8,(char (*) [17])in_stack_ffffffffffffecf0);
  boost::operator<<(in_stack_ffffffffffffecf8,(char (*) [19])in_stack_ffffffffffffecf0);
  this = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_ffffffffffffecf8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecf8,in_stack_ffffffffffffecf0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,
             in_stack_ffffffffffffed10);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_ffffffffffffece8);
  boost::unit_test::teardown_conditional<wallet::wallet_tests::ComputeTimeSmart>
            ((ComputeTimeSmart *)0xe2d7bb);
  file = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_ffffffffffffecf8,
             (pointer)in_stack_ffffffffffffecf0,(unsigned_long)in_stack_ffffffffffffece8);
  __s = local_1140;
  memset(__s,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_ffffffffffffece8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_ffffffffffffece8);
  msg = boost::operator<<(in_stack_ffffffffffffecf8,(char *)in_stack_ffffffffffffecf0);
  boost::operator<<(in_stack_ffffffffffffecf8,(char (*) [17])in_stack_ffffffffffffecf0);
  boost::operator<<(in_stack_ffffffffffffecf8,(char (*) [15])in_stack_ffffffffffffecf0);
  this_00 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_ffffffffffffecf8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)this_00,in_stack_ffffffffffffecf0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,file,(size_t)__s,(const_string *)msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_ffffffffffffece8);
  ComputeTimeSmart::~ComputeTimeSmart((ComputeTimeSmart *)in_stack_ffffffffffffece8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(ComputeTimeSmart)
{
    // New transaction should use clock time if lower than block time.
    BOOST_CHECK_EQUAL(AddTx(*m_node.chainman, m_wallet, 1, 100, 120), 100);

    // Test that updating existing transaction does not change smart time.
    BOOST_CHECK_EQUAL(AddTx(*m_node.chainman, m_wallet, 1, 200, 220), 100);

    // New transaction should use clock time if there's no block time.
    BOOST_CHECK_EQUAL(AddTx(*m_node.chainman, m_wallet, 2, 300, 0), 300);

    // New transaction should use block time if lower than clock time.
    BOOST_CHECK_EQUAL(AddTx(*m_node.chainman, m_wallet, 3, 420, 400), 400);

    // New transaction should use latest entry time if higher than
    // min(block time, clock time).
    BOOST_CHECK_EQUAL(AddTx(*m_node.chainman, m_wallet, 4, 500, 390), 400);

    // If there are future entries, new transaction should use time of the
    // newest entry that is no more than 300 seconds ahead of the clock time.
    BOOST_CHECK_EQUAL(AddTx(*m_node.chainman, m_wallet, 5, 50, 600), 300);
}